

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,Script *script)

{
  allocator local_41;
  string local_40;
  Script *local_20;
  Script *script_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  local_20 = script;
  script_local._0_4_ = witness_ver;
  script_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"",&local_41);
  Address(this,type,witness_ver,script,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const Script& script)
    : Address(type, witness_ver, script, "") {
  // do nothing
}